

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O1

QPoint QHighDpi::fromNativePixels<QPoint,QScreen>(QPoint *value,QScreen *context)

{
  int iVar1;
  QPoint QVar2;
  undefined4 in_ECX;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  ScaleAndOrigin SVar9;
  
  SVar9 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  dVar6 = 1.0 / SVar9.factor;
  dVar7 = dVar6 * (double)((*value).xp.m_i - SVar9.origin.xp.m_i);
  dVar6 = dVar6 * (double)((*value).yp.m_i - SVar9.origin.yp.m_i);
  auVar8._0_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  auVar8._8_8_ = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  auVar8 = minpd(_DAT_00684790,auVar8);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
  uVar3 = movmskpd(in_ECX,auVar5);
  iVar4 = (int)auVar8._0_8_;
  if ((uVar3 & 1) == 0) {
    iVar4 = -0x80000000;
  }
  iVar1 = (int)auVar8._8_8_;
  if ((uVar3 & 2) == 0) {
    iVar1 = -0x80000000;
  }
  QVar2.yp.m_i = SVar9.origin.yp.m_i + iVar1;
  QVar2.xp.m_i = SVar9.origin.xp.m_i + iVar4;
  return QVar2;
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}